

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O0

void intgemm::kernel_write_test<(intgemm::CPUType)4,float>(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float afVar9 [16];
  float *pfVar10;
  float *__last;
  float (*pafVar11) [16];
  size_t __n;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<float> output;
  AlignedVector<float> input;
  undefined1 auVar15 [24];
  undefined1 in_stack_fffffffffffffd80 [64];
  undefined1 auVar14 [64];
  ExprLhs<const_float_&> *in_stack_fffffffffffffdc0;
  SourceLineInfo local_130;
  StringRef local_120;
  ulong local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  AlignedVector<float> local_70;
  AlignedVector<float> local_60 [5];
  
  auVar15 = in_stack_fffffffffffffd80._8_24_;
  if (3 < kCPU) {
    AlignedVector<float>::AlignedVector
              (in_stack_fffffffffffffd80._24_8_,in_stack_fffffffffffffd80._16_8_,
               in_stack_fffffffffffffd80._8_8_);
    AlignedVector<float>::AlignedVector(auVar15._16_8_,auVar15._8_8_,auVar15._0_8_);
    pfVar10 = AlignedVector<float>::begin(local_60);
    __last = AlignedVector<float>::end(local_60);
    std::iota<float*,float>(pfVar10,__last,0.0);
    pafVar11 = AlignedVector<float>::as<float__vector(16)>(local_60);
    uVar1 = *(undefined8 *)*pafVar11;
    uVar2 = *(undefined8 *)(*pafVar11 + 2);
    uVar3 = *(undefined8 *)(*pafVar11 + 4);
    uVar4 = *(undefined8 *)(*pafVar11 + 6);
    uVar5 = *(undefined8 *)(*pafVar11 + 8);
    uVar6 = *(undefined8 *)(*pafVar11 + 10);
    uVar7 = *(undefined8 *)(*pafVar11 + 0xc);
    uVar8 = *(undefined8 *)(*pafVar11 + 0xe);
    afVar9 = *pafVar11;
    pfVar10 = AlignedVector<float>::begin(&local_70);
    auVar12 = vmovdqa64_avx512f((undefined1  [64])afVar9);
    auVar14 = vmovdqa64_avx512f(auVar12);
    auVar12 = ZEXT1664(auVar12._0_16_);
    local_c0 = uVar1;
    uStack_b8 = uVar2;
    uStack_b0 = uVar3;
    uStack_a8 = uVar4;
    uStack_a0 = uVar5;
    uStack_98 = uVar6;
    uStack_90 = uVar7;
    uStack_88 = uVar8;
    kernels::write((int)pfVar10,(void *)0x0,__n);
    for (local_c8 = 0; auVar13 = auVar12._0_16_, local_c8 < 0x10; local_c8 = local_c8 + 1) {
      local_120 = operator____catch_sr(auVar14._8_8_,auVar14._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
                 ,0x1c);
      Catch::StringRef::StringRef(auVar14._24_8_,auVar14._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar14._24_8_,auVar14._16_8_,auVar14._8_8_,auVar14._32_16_,auVar14._4_4_);
      AlignedVector<float>::operator[](&local_70,local_c8);
      Catch::Decomposer::operator<=(auVar14._0_8_,(float *)0x28dc8b);
      auVar13 = vcvtusi2ss_avx512f(auVar13,local_c8);
      auVar12 = ZEXT1664(auVar13);
      Catch::ExprLhs<float_const&>::operator==(in_stack_fffffffffffffdc0,auVar14._56_8_);
      Catch::AssertionHandler::handleExpr(auVar14._8_8_,auVar14._0_8_);
      Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
                ((BinaryExpr<const_float_&,_const_float_&> *)0x28dcf3);
      Catch::AssertionHandler::complete(auVar14._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar14._8_8_);
    }
    AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x28de0e);
    AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x28de1b);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}